

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_stat(mg_connection *conn,char *path,mg_file_stat *filep)

{
  int iVar1;
  undefined1 local_b8 [8];
  stat st;
  mg_file_stat *filep_local;
  char *path_local;
  mg_connection *conn_local;
  
  if (filep == (mg_file_stat *)0x0) {
    conn_local._4_4_ = 0;
  }
  else {
    st.__glibc_reserved[2] = (__syscall_slong_t)filep;
    memset(filep,0,0x20);
    iVar1 = mg_path_suspicious(conn,path);
    if (iVar1 == 0) {
      iVar1 = stat64(path,(stat64 *)local_b8);
      if (iVar1 == 0) {
        *(__dev_t *)st.__glibc_reserved[2] = st.st_rdev;
        *(__syscall_slong_t *)(st.__glibc_reserved[2] + 8) = st.st_atim.tv_nsec;
        *(uint *)(st.__glibc_reserved[2] + 0x10) = (uint)(((uint)st.st_nlink & 0xf000) == 0x4000);
        conn_local._4_4_ = 1;
      }
      else {
        conn_local._4_4_ = 0;
      }
    }
    else {
      conn_local._4_4_ = 0;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
mg_stat(const struct mg_connection *conn,
        const char *path,
        struct mg_file_stat *filep)
{
	struct stat st;
	if (!filep) {
		return 0;
	}
	memset(filep, 0, sizeof(*filep));

	if (mg_path_suspicious(conn, path)) {
		return 0;
	}

	if (0 == stat(path, &st)) {
		filep->size = (uint64_t)(st.st_size);
		filep->last_modified = st.st_mtime;
		filep->is_directory = S_ISDIR(st.st_mode);
		return 1;
	}

	return 0;
}